

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O3

void Sfm_CreateLevelR(Vec_Wec_t *vFanouts,Vec_Int_t *vLevelsR,Vec_Str_t *vEmpty)

{
  long lVar1;
  int iVar2;
  bool bVar3;
  int *piVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  
  if (vLevelsR->nSize != 0) {
    __assert_fail("Vec_IntSize(vLevelsR) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmNtk.c"
                  ,0x96,"void Sfm_CreateLevelR(Vec_Wec_t *, Vec_Int_t *, Vec_Str_t *)");
  }
  uVar6 = vFanouts->nSize;
  if (vLevelsR->nCap < (int)uVar6) {
    if (vLevelsR->pArray == (int *)0x0) {
      piVar4 = (int *)malloc((long)(int)uVar6 << 2);
    }
    else {
      piVar4 = (int *)realloc(vLevelsR->pArray,(long)(int)uVar6 << 2);
    }
    vLevelsR->pArray = piVar4;
    if (piVar4 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vLevelsR->nCap = uVar6;
  }
  if (0 < (int)uVar6) {
    memset(vLevelsR->pArray,0,(ulong)uVar6 * 4);
  }
  vLevelsR->nSize = uVar6;
  lVar5 = (long)vFanouts->nSize;
  if (0 < (long)vFanouts->nSize) {
    do {
      if (vFanouts->nSize < lVar5) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      lVar1 = lVar5 + -1;
      if (vEmpty == (Vec_Str_t *)0x0) {
        uVar6 = 1;
      }
      else {
        if (vEmpty->nSize < lVar5) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                        ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
        }
        uVar6 = (uint)(vEmpty->pArray[lVar1] == '\0');
      }
      lVar7 = (long)vFanouts->pArray[lVar1].nSize;
      if (lVar7 < 1) {
        iVar10 = vLevelsR->nSize;
      }
      else {
        lVar8 = 0;
        iVar9 = 0;
        do {
          iVar2 = vFanouts->pArray[lVar1].pArray[lVar8];
          if (((long)iVar2 < 0) || (iVar10 = vLevelsR->nSize, iVar10 <= iVar2)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          if (iVar9 <= vLevelsR->pArray[iVar2]) {
            iVar9 = vLevelsR->pArray[iVar2];
          }
          lVar8 = lVar8 + 1;
        } while (lVar7 != lVar8);
        uVar6 = uVar6 + iVar9;
      }
      if (iVar10 < lVar5) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      vLevelsR->pArray[lVar1] = uVar6;
      bVar3 = 1 < lVar5;
      lVar5 = lVar1;
    } while (bVar3);
  }
  return;
}

Assistant:

void Sfm_CreateLevelR( Vec_Wec_t * vFanouts, Vec_Int_t * vLevelsR, Vec_Str_t * vEmpty )
{
    Vec_Int_t * vArray;
    int i;
    assert( Vec_IntSize(vLevelsR) == 0 );
    Vec_IntFill( vLevelsR, Vec_WecSize(vFanouts), 0 );
    Vec_WecForEachLevelReverse( vFanouts, vArray, i )
        Vec_IntWriteEntry( vLevelsR, i, Sfm_ObjLevelNewR(vArray, vLevelsR, Sfm_ObjAddsLevelArray(vEmpty, i)) );
}